

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworkByPan
          (Registry *this,string *aPan,Network *aRet)

{
  ErrorCode EVar1;
  Error local_b8;
  unsigned_short local_8a;
  undefined1 local_88 [6];
  uint16_t panId;
  Network nwk;
  Network *aRet_local;
  string *aPan_local;
  Registry *this_local;
  
  nwk._88_8_ = aRet;
  Network::Network((Network *)local_88);
  local_8a = 0;
  utils::ParseInteger<unsigned_short>(&local_b8,&local_8a,aPan);
  EVar1 = Error::GetCode(&local_b8);
  Error::~Error(&local_b8);
  if (EVar1 == kNone) {
    nwk.mXpan._4_2_ = local_8a;
    this_local._7_1_ = LookupOne(this,(Network *)local_88,(Network *)nwk._88_8_);
  }
  else {
    this_local._7_1_ = kError;
  }
  Network::~Network((Network *)local_88);
  return this_local._7_1_;
}

Assistant:

Registry::Status Registry::GetNetworkByPan(const std::string &aPan, Network &aRet)
{
    Network  nwk{};
    uint16_t panId = 0;

    if (utils::ParseInteger(panId, aPan).GetCode() != ErrorCode::kNone)
    {
        return Registry::Status::kError;
    }
    nwk.mPan = panId;
    return LookupOne(nwk, aRet);
}